

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int preprocessInputBuffer
              (string *in_file_path,StkFrames *preprocess_buff,double dst_rate,double shifter_weight
              ,int centerBiasLevel,bool use_linearity_correction)

{
  ulong uVar1;
  uint nFrames;
  size_t sVar2;
  StkFloat *pSVar3;
  double dVar4;
  double dVar5;
  double local_1d8;
  uint local_1c4;
  int local_164;
  int local_160;
  int i_7;
  int i_6;
  ulong local_138;
  size_t i_5;
  StkFrames progress_out_buff;
  undefined1 local_f8 [4];
  int i_4;
  StkFrames filtered_shifter_buff;
  int i_3;
  double coeffRR;
  double env;
  double target;
  int i_2;
  int now_sample;
  int i_1;
  int window_len;
  double start_sample;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  StkFrames rectify_buff;
  double threshold_level;
  double centerBiasLevelf;
  int src_frames;
  bool use_linearity_correction_local;
  int centerBiasLevel_local;
  double shifter_weight_local;
  double dst_rate_local;
  StkFrames *preprocess_buff_local;
  string *in_file_path_local;
  
  sVar2 = stk::StkFrames::size(preprocess_buff);
  nFrames = (uint)sVar2;
  threshold_level = (double)centerBiasLevel;
  if (use_linearity_correction) {
    dVar4 = linearToDacCurve(threshold_level);
    threshold_level = dVar4 * 128.0;
  }
  if (63.0 < threshold_level) {
    threshold_level = threshold_level - 128.0;
  }
  rectify_buff.bufferSize_ = (size_t)(-threshold_level / 64.0);
  stk::StkFrames::StkFrames((StkFrames *)local_78,nFrames,1);
  for (local_7c = 0; local_7c < (int)nFrames; local_7c = local_7c + 1) {
    if (threshold_level < 0.0) {
      pSVar3 = stk::StkFrames::operator[](preprocess_buff,(long)local_7c);
      if (*pSVar3 < (double)rectify_buff.bufferSize_) {
        pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_78,(long)local_7c);
        *pSVar3 = 0.0;
      }
      else {
        pSVar3 = stk::StkFrames::operator[](preprocess_buff,(long)local_7c);
        dVar4 = *pSVar3 - (double)rectify_buff.bufferSize_;
        pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_78,(long)local_7c);
        *pSVar3 = dVar4;
      }
    }
    else {
      pSVar3 = stk::StkFrames::operator[](preprocess_buff,(long)local_7c);
      sVar2 = rectify_buff.bufferSize_;
      if (*pSVar3 < (double)rectify_buff.bufferSize_) {
        pSVar3 = stk::StkFrames::operator[](preprocess_buff,(long)local_7c);
        dVar4 = *pSVar3;
        pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_78,(long)local_7c);
        *pSVar3 = (double)sVar2 - dVar4;
      }
      else {
        pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_78,(long)local_7c);
        *pSVar3 = 0.0;
      }
    }
  }
  _i_1 = 0.0;
  local_1c4 = nFrames;
  if (0x800 < (int)nFrames) {
    local_1c4 = 0x800;
  }
  for (i_2 = 0; i_2 < (int)local_1c4; i_2 = i_2 + 1) {
    pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_78,(long)i_2);
    _i_1 = *pSVar3 / (double)(int)local_1c4 + _i_1;
  }
  if (force_initial_volume < 0) {
    local_1d8 = _i_1 * 64.0;
  }
  else {
    local_1d8 = (double)(force_initial_volume / 2);
  }
  target._4_4_ = (int)local_1d8 << 1;
  for (target._0_4_ = 0; target._0_4_ < (int)nFrames; target._0_4_ = target._0_4_ + 1) {
    pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_78,(long)target._0_4_);
    env = *pSVar3 * 128.0;
    if (((double)rectify_buff.bufferSize_ != 1.0) || (NAN((double)rectify_buff.bufferSize_))) {
      env = env / (1.0 - ABS((double)rectify_buff.bufferSize_));
    }
    if (env <= (double)target._4_4_) {
      target._4_4_ = target._4_4_ + -2;
    }
    else {
      target._4_4_ = target._4_4_ + 2;
    }
    if (target._4_4_ < 0) {
      target._4_4_ = 0;
    }
    if (0x7f < target._4_4_) {
      target._4_4_ = 0x7f;
    }
    pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_78,(long)target._0_4_);
    *pSVar3 = (double)target._4_4_ * 0.0078125;
  }
  coeffRR = 0.0;
  dVar4 = exp(-250.0 / dst_rate);
  for (filtered_shifter_buff.bufferSize_._4_4_ = 0;
      filtered_shifter_buff.bufferSize_._4_4_ < (int)nFrames;
      filtered_shifter_buff.bufferSize_._4_4_ = filtered_shifter_buff.bufferSize_._4_4_ + 1) {
    pSVar3 = stk::StkFrames::operator[]
                       ((StkFrames *)local_78,(long)filtered_shifter_buff.bufferSize_._4_4_);
    if (*pSVar3 < coeffRR) {
      pSVar3 = stk::StkFrames::operator[]
                         ((StkFrames *)local_78,(long)filtered_shifter_buff.bufferSize_._4_4_);
      coeffRR = (1.0 - dVar4) * *pSVar3 + coeffRR * dVar4;
      pSVar3 = stk::StkFrames::operator[]
                         ((StkFrames *)local_78,(long)filtered_shifter_buff.bufferSize_._4_4_);
      *pSVar3 = coeffRR;
    }
    else {
      pSVar3 = stk::StkFrames::operator[]
                         ((StkFrames *)local_78,(long)filtered_shifter_buff.bufferSize_._4_4_);
      coeffRR = *pSVar3;
    }
  }
  stk::StkFrames::StkFrames((StkFrames *)local_f8,nFrames,1);
  firLowpassFilter((StkFrames *)local_78,(StkFrames *)local_f8,20.0 / (dst_rate * 0.5),_i_1);
  for (progress_out_buff.bufferSize_._4_4_ = 0; progress_out_buff.bufferSize_._4_4_ < (int)nFrames;
      progress_out_buff.bufferSize_._4_4_ = progress_out_buff.bufferSize_._4_4_ + 1) {
    pSVar3 = stk::StkFrames::operator[]
                       ((StkFrames *)local_f8,(long)progress_out_buff.bufferSize_._4_4_);
    *pSVar3 = *pSVar3 * 2.0;
  }
  if ((output_envelope & 1U) != 0) {
    sVar2 = stk::StkFrames::size((StkFrames *)local_f8);
    stk::StkFrames::StkFrames((StkFrames *)&i_5,(uint)sVar2,1);
    for (local_138 = 0; uVar1 = local_138, sVar2 = stk::StkFrames::size((StkFrames *)local_f8),
        uVar1 < sVar2; local_138 = local_138 + 1) {
      pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_f8,local_138);
      dVar4 = *pSVar3;
      pSVar3 = stk::StkFrames::operator[]((StkFrames *)&i_5,local_138);
      *pSVar3 = dVar4 * 0.5;
      pSVar3 = stk::StkFrames::operator[]((StkFrames *)&i_5,local_138);
      if (1.0 < *pSVar3) {
        pSVar3 = stk::StkFrames::operator[]((StkFrames *)&i_5,local_138);
        *pSVar3 = 1.0;
      }
      pSVar3 = stk::StkFrames::operator[]((StkFrames *)&i_5,local_138);
      if (*pSVar3 <= -1.0 && *pSVar3 != -1.0) {
        pSVar3 = stk::StkFrames::operator[]((StkFrames *)&i_5,local_138);
        *pSVar3 = -1.0;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i_6,"_envelope",(allocator *)((long)&i_7 + 3));
    outputBufferToFile(in_file_path,(StkFrames *)&i_5,(string *)&i_6,dst_rate);
    std::__cxx11::string::~string((string *)&i_6);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_7 + 3));
    stk::StkFrames::~StkFrames((StkFrames *)&i_5);
  }
  for (local_160 = 0; local_160 < (int)nFrames; local_160 = local_160 + 1) {
    pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_f8,(long)local_160);
    *pSVar3 = shifter_weight * *pSVar3;
    if (threshold_level < 0.0) {
      dVar5 = 2.0 - (double)rectify_buff.bufferSize_;
      pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_f8,(long)local_160);
      dVar4 = *pSVar3;
      pSVar3 = stk::StkFrames::operator[](preprocess_buff,(long)local_160);
      *pSVar3 = (dVar5 - dVar4) + *pSVar3;
    }
    else {
      pSVar3 = stk::StkFrames::operator[]((StkFrames *)local_f8,(long)local_160);
      dVar4 = *pSVar3 - (double)rectify_buff.bufferSize_;
      pSVar3 = stk::StkFrames::operator[](preprocess_buff,(long)local_160);
      *pSVar3 = dVar4 + *pSVar3;
    }
    pSVar3 = stk::StkFrames::operator[](preprocess_buff,(long)local_160);
    *pSVar3 = *pSVar3 * 0.5;
  }
  if (use_linearity_correction) {
    for (local_164 = 0; local_164 < (int)nFrames; local_164 = local_164 + 1) {
      pSVar3 = stk::StkFrames::operator[](preprocess_buff,(long)local_164);
      dVar4 = *pSVar3;
      pSVar3 = stk::StkFrames::operator[](preprocess_buff,(long)local_164);
      *pSVar3 = 22368.0 / ((159.79 / (dVar4 * 0.5771522095) + -100.0) * 128.0);
    }
  }
  stk::StkFrames::~StkFrames((StkFrames *)local_f8);
  stk::StkFrames::~StkFrames((StkFrames *)local_78);
  return 0;
}

Assistant:

int preprocessInputBuffer(const std::string &in_file_path,
						  stk::StkFrames &preprocess_buff, double dst_rate,
						  double shifter_weight,
						  int centerBiasLevel, bool use_linearity_correction)
{
	int	src_frames = (int)preprocess_buff.size();
	
	// thresholdの補正
	double centerBiasLevelf = centerBiasLevel;
	if (use_linearity_correction) {
		centerBiasLevelf = 128.0 * linearToDacCurve(centerBiasLevelf);
	}
	
	if (centerBiasLevelf > 63) {
		centerBiasLevelf -= 128;
	}
	double threshold_level = -centerBiasLevelf / 64.0;
	
	// 波形を下半分のみ残して半波整流する
	stk::StkFrames rectify_buff(src_frames, 1);
	for (int i=0; i<src_frames; ++i) {
		if (centerBiasLevelf >= 0) {
			if (preprocess_buff[i] >= threshold_level) {
				rectify_buff[i] = 0;
			}
			else {
				rectify_buff[i] = threshold_level - preprocess_buff[i];
			}
		}
		else {
			if (preprocess_buff[i] >= threshold_level) {
				rectify_buff[i] = preprocess_buff[i] - threshold_level;
			}
			else {
				rectify_buff[i] = 0;
			}
		}
	}
	
	// 先頭2048サンプルの平均値をとって初期値とする
	double start_sample = .0;
	{
		int window_len = (src_frames > 2048)?2048 : src_frames;
		for (int i=0; i<window_len; ++i) {
			start_sample += rectify_buff[i] / static_cast<double>(window_len);
		}
	}
	
	// DPCM変換後に近い波形になるように値が2/128ずつだけ変化するようにする
	{
		int now_sample = 2*static_cast<int>((force_initial_volume >= 0)?(force_initial_volume/2):(start_sample * 64.0));
		for (int i=0; i<src_frames; ++i) {
			double target = rectify_buff[i] * 128;
			if (threshold_level != 1.0) {
				target /= 1.0 - std::fabs(threshold_level);
			}
			if (target > now_sample) {
				now_sample += 2;
			}
			else {
				now_sample -= 2;
			}
			if (now_sample < 0) now_sample = 0;
			if (now_sample > 127) now_sample = 127;
			rectify_buff[i] = now_sample / 128.0;
		}
	}
	
	// ピーク&ホールド
	{
		double env = .0;
		double coeffRR = std::exp(-250.0 / dst_rate);
		for (int i=0; i<src_frames; ++i) {
			if (rectify_buff[i] >= env) {
				env = rectify_buff[i];
			}
			else {
				env *= coeffRR;
				env += (1.0 - coeffRR) * rectify_buff[i];
				rectify_buff[i] = env;
			}
		}
	}
	
//	{
//		stk::StkFrames	progress_out_buff((uint32_t)rectify_buff.size(), 1);
//		for (size_t i=0; i<rectify_buff.size(); ++i) {
//			progress_out_buff[i] = rectify_buff[i];
//			if (progress_out_buff[i] > 1.0) progress_out_buff[i] = 1.0;
//			if (progress_out_buff[i] < -1.0) progress_out_buff[i] = -1.0;
//		}
//		outputBufferToFile(in_file_path, progress_out_buff, "_rectify", dst_rate);
//	}
	
	// 整流波形にLPFを掛けて可聴成分を除去
	stk::StkFrames	filtered_shifter_buff(src_frames, 1);
	firLowpassFilter(rectify_buff,
					 filtered_shifter_buff,
					 20.0 / (dst_rate/2),
					 start_sample);
	// ゲイン調整
	for (int i=0; i<src_frames; ++i) {
		filtered_shifter_buff[i] *= 2.0;
	}
	
	if (output_envelope) {
		// エンベロープ波形
		stk::StkFrames	progress_out_buff((uint32_t)filtered_shifter_buff.size(), 1);
		for (size_t i=0; i<filtered_shifter_buff.size(); ++i) {
			progress_out_buff[i] = filtered_shifter_buff[i] * 0.5;
			if (progress_out_buff[i] > 1.0) progress_out_buff[i] = 1.0;
			if (progress_out_buff[i] < -1.0) progress_out_buff[i] = -1.0;
		}
		outputBufferToFile(in_file_path, progress_out_buff, "_envelope", dst_rate);
	}
	
	// 平滑された整流波形を加算してゲイン調整
	for (int i=0; i<src_frames; ++i) {
		filtered_shifter_buff[i] *= shifter_weight;
		if (centerBiasLevelf >= 0) {
			preprocess_buff[i] += filtered_shifter_buff[i] - threshold_level;
		}
		else {
			preprocess_buff[i] += 2.0 - threshold_level - filtered_shifter_buff[i];
		}
		preprocess_buff[i] *= 0.5;		// シフトによって倍になったピークを1.0に落とす
	}
	
	// 非線形DAC特性の補正
	if (use_linearity_correction) {
		for (int i=0; i<src_frames; ++i) {
			preprocess_buff[i] = 22368.0 / (128 * ((159.79 / (0.5771522095 * preprocess_buff[i])) - 100));
		}
	}
	
	return 0;
}